

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs_file_base.cpp
# Opt level: O3

void __thiscall foxxll::ufs_file_base::close_remove(ufs_file_base *this)

{
  int iVar1;
  int *piVar2;
  int in_ESI;
  char *local_190;
  Logger local_188;
  
  close(this,in_ESI);
  if (this->is_device_ == true) {
    tlx::Logger::Logger(&local_188);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_188,"remove() path=",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_188,(this->filename_)._M_dataplus._M_p,
               (this->filename_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_188," skipped as file is device node",0x1f);
  }
  else {
    iVar1 = remove((this->filename_)._M_dataplus._M_p);
    if (iVar1 == 0) {
      return;
    }
    tlx::Logger::Logger(&local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_188,"remove() error on path=",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_188,(this->filename_)._M_dataplus._M_p,
               (this->filename_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_188," error=",7);
    piVar2 = __errno_location();
    local_190 = strerror(*piVar2);
    tlx::LoggerFormatter<char_*,_void>::print((ostream *)&local_188,&local_190);
  }
  tlx::Logger::~Logger(&local_188);
  return;
}

Assistant:

void ufs_file_base::close_remove()
{
    close();

    if (is_device_) {
        TLX_LOG1 << "remove() path=" << filename_
                 << " skipped as file is device node";
        return;
    }

    if (::remove(filename_.c_str()) != 0)
        TLX_LOG1 << "remove() error on path=" << filename_
                 << " error=" << strerror(errno);
}